

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

int parseNumber(string *str,int begin,int end)

{
  int iVar1;
  char *pcVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_44;
  size_t sStack_40;
  int a;
  size_t lastloc;
  string s;
  int end_local;
  int begin_local;
  string *str_local;
  
  s.field_2._8_4_ = end;
  s.field_2._12_4_ = begin;
  std::__cxx11::string::substr((ulong)&lastloc,(ulong)str);
  if ((int)s.field_2._12_4_ < (int)s.field_2._8_4_) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    iVar1 = isdigit((int)*pcVar2);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::stoi((string *)&lastloc,&stack0xffffffffffffffc0,10);
      local_44 = iVar1;
      if (sStack_40 != (long)(int)(s.field_2._8_4_ - s.field_2._12_4_)) {
        local_99 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_98,"expected the entire string ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lastloc
                      );
        std::operator+(&local_78,&local_98," to be a number");
        std::runtime_error::runtime_error(prVar3,(string *)&local_78);
        local_99 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::~string((string *)&lastloc);
      return iVar1;
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_e0,"expected the entire string ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lastloc);
  std::operator+(&local_c0,&local_e0," to be a number");
  std::runtime_error::runtime_error(prVar3,(string *)&local_c0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int parseNumber(const std::string &str, int begin, int end)
{
  std::string s { str.substr(begin, end-begin) };
  if ((begin < end) and isdigit(str[begin])) {
    //    std::cout << "found number at: " << begin << " and " << end << std::endl;
    size_t lastloc;
    int a = std::stoi(s, &lastloc, 10); // Not correct yet:  "23(a+b)" return val will be 2
    if (lastloc != end-begin)
      throw std::runtime_error("expected the entire string " + s + " to be a number");
    return a;
  }
  throw std::runtime_error("expected the entire string " + s + " to be a number");
}